

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldInsertUint::test
          (ShaderBitfieldOperationCaseBitfieldInsertUint *this,Data *data)

{
  uint local_3c;
  GLuint expected;
  GLuint mask;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseBitfieldInsertUint *this_local;
  
  expected = 0;
  while( true ) {
    if (this->m_components <= (int)expected) {
      return true;
    }
    if (data->bits == 0x20) {
      local_3c = 0xffffffff;
    }
    else {
      local_3c = (1 << ((byte)data->bits & 0x1f)) - 1;
    }
    if (data->outUvec4[(int)expected] !=
        (data->inUvec4[(int)expected] & (local_3c << ((byte)data->offset & 0x1f) ^ 0xffffffff) |
        (data->in2Uvec4[(int)expected] & local_3c) << ((byte)data->offset & 0x1f))) break;
    expected = expected + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint mask = (data->bits == 32) ? ~0u : (1 << data->bits) - 1;
			GLuint expected =
				(data->inUvec4[i] & ~(mask << data->offset)) | ((data->in2Uvec4[i] & mask) << data->offset);
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}